

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

void __thiscall
tsl::detail_robin_hash::
robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_impl(robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *this,size_type count_)

{
  bool bVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  undefined8 uVar5;
  size_t sVar6;
  size_type sVar7;
  pointer pbVar8;
  size_type sVar9;
  ulong uVar10;
  SelectorEqual *in_RCX;
  ulong uVar11;
  short __tmp_2;
  SelectorHash *in_RDX;
  ushort uVar12;
  bucket_entry *pbVar13;
  allocator<objc_selector_*> *in_R8;
  objc_selector *__tmp_1;
  bucket_entry<objc_selector_*,_true> *bucket;
  pointer pbVar14;
  pointer pbVar15;
  unsigned_long __tmp;
  robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  local_80;
  
  robin_hash(&local_80,count_,in_RDX,in_RCX,in_R8,this->m_min_load_factor,this->m_max_load_factor);
  pbVar14 = (this->m_buckets_data).
            super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar15 = (this->m_buckets_data).
            super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar14 != pbVar15) {
LAB_0011e3fa:
    if (pbVar14->m_dist_from_ideal_bucket != -1) {
      if (local_80.m_bucket_count < 0x100000001) {
        uVar10 = (ulong)(pbVar14->super_bucket_entry_hash<true>).m_hash;
      }
      else {
        uVar10 = robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::hash_key<objc_selector*>
                           (*(robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                              **)pbVar14->m_value,(objc_selector **)count_);
      }
      uVar12 = 0;
      uVar11 = uVar10;
      do {
        uVar11 = local_80.super_power_of_two_growth_policy<2UL>.m_mask & uVar11;
        uVar3 = local_80.m_buckets[uVar11].m_dist_from_ideal_bucket;
        count_ = (size_type)uVar3;
        if ((short)uVar3 < (short)uVar12) {
          pbVar13 = local_80.m_buckets + uVar11;
          uVar5 = *(undefined8 *)pbVar14->m_value;
          if (uVar3 == 0xffff) goto LAB_0011e46c;
          *(undefined8 *)pbVar14->m_value = *(undefined8 *)pbVar13->m_value;
          *(undefined8 *)pbVar13->m_value = uVar5;
          pbVar13->m_dist_from_ideal_bucket = uVar12;
          uVar4 = (pbVar13->super_bucket_entry_hash<true>).m_hash;
          (pbVar13->super_bucket_entry_hash<true>).m_hash = (truncated_hash_type)uVar10;
          uVar10 = (ulong)uVar4;
          uVar12 = uVar3;
        }
        uVar12 = uVar12 + 1;
        uVar11 = uVar11 + 1;
      } while( true );
    }
    goto LAB_0011e476;
  }
LAB_0011e48b:
  sVar6 = (this->super_power_of_two_growth_policy<2UL>).m_mask;
  (this->super_power_of_two_growth_policy<2UL>).m_mask =
       local_80.super_power_of_two_growth_policy<2UL>.m_mask;
  (this->m_buckets_data).
  super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_80.m_buckets_data.
       super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_buckets_data).
  super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_80.m_buckets_data.
       super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar13 = this->m_buckets;
  (this->m_buckets_data).
  super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_80.m_buckets_data.
       super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this->m_buckets = local_80.m_buckets;
  sVar9 = this->m_bucket_count;
  local_80.m_nb_elements = this->m_nb_elements;
  this->m_bucket_count = local_80.m_bucket_count;
  sVar7 = this->m_load_threshold;
  this->m_load_threshold = local_80.m_load_threshold;
  uVar5._0_4_ = this->m_min_load_factor;
  uVar5._4_4_ = this->m_max_load_factor;
  this->m_min_load_factor = local_80.m_min_load_factor;
  this->m_max_load_factor = local_80.m_max_load_factor;
  bVar1 = this->m_grow_on_next_insert;
  this->m_grow_on_next_insert = local_80.m_grow_on_next_insert;
  bVar2 = this->m_try_shrink_on_next_insert;
  this->m_try_shrink_on_next_insert = local_80.m_try_shrink_on_next_insert;
  local_80.super_power_of_two_growth_policy<2UL>.m_mask = sVar6;
  local_80.m_buckets_data.
  super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar14;
  local_80.m_buckets_data.
  super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar15;
  local_80.m_buckets_data.
  super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar8;
  local_80.m_buckets = pbVar13;
  local_80.m_bucket_count = sVar9;
  local_80.m_load_threshold = sVar7;
  local_80._64_8_ = uVar5;
  local_80.m_grow_on_next_insert = bVar1;
  local_80.m_try_shrink_on_next_insert = bVar2;
  std::
  vector<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
  ::~vector(&local_80.m_buckets_data);
  return;
LAB_0011e46c:
  *(undefined8 *)pbVar13->m_value = uVar5;
  (pbVar13->super_bucket_entry_hash<true>).m_hash = (truncated_hash_type)uVar10;
  pbVar13->m_dist_from_ideal_bucket = uVar12;
LAB_0011e476:
  pbVar14 = pbVar14 + 1;
  if (pbVar14 == pbVar15) goto code_r0x0011e483;
  goto LAB_0011e3fa;
code_r0x0011e483:
  pbVar14 = (this->m_buckets_data).
            super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar15 = (this->m_buckets_data).
            super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  goto LAB_0011e48b;
}

Assistant:

void rehash_impl(size_type count_) {
    robin_hash new_table(count_, static_cast<Hash&>(*this),
                         static_cast<KeyEqual&>(*this), get_allocator(),
                         m_min_load_factor, m_max_load_factor);
    tsl_rh_assert(size() <= new_table.m_load_threshold);

    const bool use_stored_hash =
        USE_STORED_HASH_ON_REHASH(new_table.bucket_count());
    for (auto& bucket : m_buckets_data) {
      if (bucket.empty()) {
        continue;
      }

      const std::size_t hash =
          use_stored_hash ? bucket.truncated_hash()
                          : new_table.hash_key(KeySelect()(bucket.value()));

      new_table.insert_value_on_rehash(new_table.bucket_for_hash(hash), 0,
                                       bucket_entry::truncate_hash(hash),
                                       std::move(bucket.value()));
    }

    new_table.m_nb_elements = m_nb_elements;
    new_table.swap(*this);
  }